

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

bool ASDCP::MXF::GetEditRateFromFP(OP1aHeader *header,Rational *edit_rate)

{
  bool bVar1;
  size_t sVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  Dictionary *pDVar6;
  byte_t *pbVar7;
  ILogSink *pIVar8;
  size_type sVar9;
  reference ppIVar10;
  reference pUVar11;
  pointer pUVar12;
  char *pcVar13;
  UUID *pUVar14;
  reference pvVar15;
  undefined8 uVar16;
  long local_3a8;
  long local_338;
  long local_2f0;
  long local_2c0;
  SourceClip *source_clip;
  long local_210;
  Sequence *sequence;
  long local_1a0;
  Track *track;
  __normal_iterator<Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_> local_130;
  __normal_iterator<Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_> local_128;
  SourcePackage *local_120;
  long local_118;
  SourcePackage *source_package;
  const_iterator i;
  char buf [64];
  Result_t local_b0 [8];
  Result_t result;
  undefined1 local_48 [8];
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> temp_items
  ;
  InterchangeObject *temp_item;
  bool has_first_item;
  Rational *edit_rate_local;
  OP1aHeader *header_local;
  
  bVar1 = false;
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::list
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_48);
  pDVar6 = DefaultCompositeDict();
  pbVar7 = Dictionary::ul(pDVar6,MDD_SourcePackage);
  (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x16])
            (local_b0,header,pbVar7,local_48);
  iVar5 = Kumu::Result_t::operator_cast_to_int(local_b0);
  if (iVar5 < 0) {
    pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar8,"The MXF header does not contain a FilePackage item.\n");
    header_local._7_1_ = false;
  }
  else {
    sVar9 = std::__cxx11::
            list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
            ::size((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                    *)local_48);
    if (sVar9 == 1) {
      __gnu_cxx::
      __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>::
      __normal_iterator((__normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                         *)&source_package);
      ppIVar10 = std::__cxx11::
                 list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                 ::front((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                          *)local_48);
      if (*ppIVar10 == (value_type)0x0) {
        local_2c0 = 0;
      }
      else {
        local_2c0 = __dynamic_cast(*ppIVar10,&InterchangeObject::typeinfo,&SourcePackage::typeinfo,0
                                  );
      }
      local_118 = local_2c0;
      if (local_2c0 == 0) {
        __assert_fail("source_package",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                      ,0x7e1,
                      "bool ASDCP::MXF::GetEditRateFromFP(ASDCP::MXF::OP1aHeader &, ASDCP::Rational &)"
                     );
      }
      local_128._M_current =
           (UUID *)std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::begin
                             ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)(local_2c0 + 0x138)
                             );
      __gnu_cxx::
      __normal_iterator<Kumu::UUID_const*,std::vector<Kumu::UUID,std::allocator<Kumu::UUID>>>::
      __normal_iterator<Kumu::UUID*>
                ((__normal_iterator<Kumu::UUID_const*,std::vector<Kumu::UUID,std::allocator<Kumu::UUID>>>
                  *)&local_120,&local_128);
      source_package = local_120;
      while( true ) {
        local_130._M_current =
             (UUID *)std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::end
                               ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                                (local_118 + 0x138));
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                            *)&source_package,&local_130);
        if (!bVar3) break;
        pUVar11 = __gnu_cxx::
                  __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                  ::operator*((__normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                               *)&source_package);
        (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x13])
                  (&track,header,pUVar11,
                   &temp_items.
                    super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                    ._M_impl._M_node._M_size);
        Kumu::Result_t::operator=(local_b0,(Result_t *)&track);
        Kumu::Result_t::~Result_t((Result_t *)&track);
        iVar5 = Kumu::Result_t::operator_cast_to_int(local_b0);
        if (iVar5 < 0) {
          pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
          pUVar12 = __gnu_cxx::
                    __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                    ::operator->((__normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                                  *)&source_package);
          pcVar13 = Kumu::UUID::EncodeHex(pUVar12,(char *)&i,0x40);
          Kumu::ILogSink::Error
                    (pIVar8,"The MXF header is incomplete: strong reference %s leads nowhere.\n",
                     pcVar13);
          header_local._7_1_ = false;
          goto LAB_00245d27;
        }
        if (temp_items.
            super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
            ._M_impl._M_node._M_size == 0) {
          local_2f0 = 0;
        }
        else {
          local_2f0 = __dynamic_cast(temp_items.
                                     super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                                     ._M_impl._M_node._M_size,&InterchangeObject::typeinfo,
                                     &Track::typeinfo,0);
        }
        local_1a0 = local_2f0;
        if (local_2f0 == 0) {
          pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
          pUVar12 = __gnu_cxx::
                    __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                    ::operator->((__normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                                  *)&source_package);
          pcVar13 = Kumu::UUID::EncodeHex(pUVar12,(char *)&i,0x40);
          Kumu::ILogSink::Error
                    (pIVar8,"The MXF header is incomplete: %s is not a Track item.\n",pcVar13);
          header_local._7_1_ = false;
          goto LAB_00245d27;
        }
        pUVar14 = optional_property::operator_cast_to_UUID_((optional_property *)(local_2f0 + 0xd8))
        ;
        (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x13])
                  (&sequence,header,pUVar14,
                   &temp_items.
                    super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                    ._M_impl._M_node._M_size);
        Kumu::Result_t::operator=(local_b0,(Result_t *)&sequence);
        Kumu::Result_t::~Result_t((Result_t *)&sequence);
        iVar5 = Kumu::Result_t::operator_cast_to_int(local_b0);
        if (iVar5 < 0) {
          pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
          pUVar12 = __gnu_cxx::
                    __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                    ::operator->((__normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                                  *)&source_package);
          pcVar13 = Kumu::UUID::EncodeHex(pUVar12,(char *)&i,0x40);
          Kumu::ILogSink::Error
                    (pIVar8,"The MXF header is incomplete: strong reference %s leads nowhere.\n",
                     pcVar13);
          header_local._7_1_ = false;
          goto LAB_00245d27;
        }
        if (temp_items.
            super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
            ._M_impl._M_node._M_size == 0) {
          local_338 = 0;
        }
        else {
          local_338 = __dynamic_cast(temp_items.
                                     super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                                     ._M_impl._M_node._M_size,&InterchangeObject::typeinfo,
                                     &Sequence::typeinfo,0);
        }
        local_210 = local_338;
        if (local_338 == 0) {
          pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
          pUVar14 = optional_property<Kumu::UUID>::get
                              ((optional_property<Kumu::UUID> *)(local_1a0 + 0xd8));
          pcVar13 = Kumu::UUID::EncodeHex(pUVar14,(char *)&i,0x40);
          Kumu::ILogSink::Error
                    (pIVar8,"The MXF header is incomplete: %s is not a Sequence item.\n",pcVar13);
          header_local._7_1_ = false;
          goto LAB_00245d27;
        }
        sVar9 = std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::size
                          ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)(local_338 + 0xd8));
        if (sVar9 != 1) {
          pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
          sVar9 = std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::size
                            ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)(local_210 + 0xd8));
          Kumu::ILogSink::Error
                    (pIVar8,
                     "The Sequence item must contain one reference to an esence item, found %d.\n",
                     sVar9);
          header_local._7_1_ = false;
          goto LAB_00245d27;
        }
        pvVar15 = std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::front
                            ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)(local_210 + 0xd8));
        (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x13])
                  (&source_clip,header,pvVar15,
                   &temp_items.
                    super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                    ._M_impl._M_node._M_size);
        Kumu::Result_t::operator=(local_b0,(Result_t *)&source_clip);
        Kumu::Result_t::~Result_t((Result_t *)&source_clip);
        iVar5 = Kumu::Result_t::operator_cast_to_int(local_b0);
        sVar2 = temp_items.
                super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                ._M_impl._M_node._M_size;
        if (iVar5 < 0) {
          pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
          pvVar15 = std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::front
                              ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)(local_210 + 0xd8)
                              );
          pcVar13 = Kumu::UUID::EncodeHex(pvVar15,(char *)&i,0x40);
          Kumu::ILogSink::Error
                    (pIVar8,"The MXF header is incomplete: strong reference %s leads nowhere.\n",
                     pcVar13);
          header_local._7_1_ = false;
          goto LAB_00245d27;
        }
        pDVar6 = DefaultCompositeDict();
        pbVar7 = Dictionary::ul(pDVar6,MDD_SourceClip);
        bVar4 = (**(code **)(*(long *)sVar2 + 0x78))(sVar2,pbVar7);
        sVar2 = temp_items.
                super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                ._M_impl._M_node._M_size;
        if ((bVar4 & 1) == 0) {
          pDVar6 = DefaultCompositeDict();
          pbVar7 = Dictionary::ul(pDVar6,MDD_TimecodeComponent);
          bVar4 = (**(code **)(*(long *)sVar2 + 0x78))(sVar2,pbVar7);
          if ((bVar4 & 1) == 0) {
            pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
            uVar16 = (**(code **)(*(long *)temp_items.
                                           super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                                           ._M_impl._M_node._M_size + 0x80))();
            Kumu::ILogSink::Error
                      (pIVar8,"Reference from Sequence to an unexpected type: %s.\n",uVar16);
            header_local._7_1_ = false;
            goto LAB_00245d27;
          }
        }
        else {
          if (temp_items.
              super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              ._M_impl._M_node._M_size == 0) {
            local_3a8 = 0;
          }
          else {
            local_3a8 = __dynamic_cast(temp_items.
                                       super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                                       ._M_impl._M_node._M_size,&InterchangeObject::typeinfo,
                                       &SourceClip::typeinfo,0);
          }
          if (local_3a8 == 0) {
            pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
            pvVar15 = std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::front
                                ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                                 (local_210 + 0xd8));
            pcVar13 = Kumu::UUID::EncodeHex(pvVar15,(char *)&i,0x40);
            Kumu::ILogSink::Error
                      (pIVar8,"The MXF header is incomplete: %s is not a SourceClip item.\n",pcVar13
                      );
            header_local._7_1_ = false;
            goto LAB_00245d27;
          }
          if (bVar1) {
            bVar3 = ASDCP::Rational::operator!=(edit_rate,(Rational *)(local_1a0 + 0x108));
            if (bVar3) {
              pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
              pvVar15 = std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::front
                                  ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                                   (local_210 + 0xd8));
              pcVar13 = Kumu::UUID::EncodeHex(pvVar15,(char *)&i,0x40);
              Kumu::ILogSink::Error
                        (pIVar8,
                         "The MXF header is incomplete: %s EditRate value does not match others in the file.\n"
                         ,pcVar13);
              header_local._7_1_ = false;
              goto LAB_00245d27;
            }
          }
          else {
            *edit_rate = *(Rational *)(local_1a0 + 0x108);
            bVar1 = true;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
        ::operator++((__normal_iterator<const_Kumu::UUID_*,_std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                      *)&source_package);
      }
      header_local._7_1_ = true;
    }
    else {
      pIVar8 = (ILogSink *)Kumu::DefaultLogSink();
      sVar9 = std::__cxx11::
              list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              ::size((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                      *)local_48);
      Kumu::ILogSink::Error
                (pIVar8,"The MXF header must contain one FilePackage item, found %d.\n",sVar9);
      header_local._7_1_ = false;
    }
  }
LAB_00245d27:
  Kumu::Result_t::~Result_t(local_b0);
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::~list
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_48);
  return header_local._7_1_;
}

Assistant:

bool
ASDCP::MXF::GetEditRateFromFP(ASDCP::MXF::OP1aHeader& header, ASDCP::Rational& edit_rate)
{
  bool has_first_item = false;

  MXF::InterchangeObject* temp_item;
  std::list<MXF::InterchangeObject*> temp_items;

  Result_t result = header.GetMDObjectsByType(DefaultCompositeDict().ul(MDD_SourcePackage), temp_items);

  if ( KM_FAILURE(result) )
    {
      DefaultLogSink().Error("The MXF header does not contain a FilePackage item.\n");
      return false;
    }

  if ( temp_items.size() != 1 )
    {
      DefaultLogSink().Error("The MXF header must contain one FilePackage item, found %d.\n", temp_items.size());
      return false;
    }

  char buf[64];
  MXF::Array<UUID>::const_iterator i;
  MXF::SourcePackage *source_package = dynamic_cast<MXF::SourcePackage*>(temp_items.front());
  assert(source_package);

  for ( i = source_package->Tracks.begin(); i != source_package->Tracks.end(); ++i )
    {
      // Track
      result = header.GetMDObjectByID(*i, &temp_item);

      if ( KM_FAILURE(result) )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: strong reference %s leads nowhere.\n",
				 i->EncodeHex(buf, 64));
	  return false;
	}

      MXF::Track *track = dynamic_cast<MXF::Track*>(temp_item);

      if ( track == 0 )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: %s is not a Track item.\n",
				 i->EncodeHex(buf, 64));
	  return false;
	}

      // Sequence
      result = header.GetMDObjectByID(track->Sequence, &temp_item);

      if ( KM_FAILURE(result) )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: strong reference %s leads nowhere.\n",
				 i->EncodeHex(buf, 64));
	  return false;
	}

      MXF::Sequence *sequence = dynamic_cast<MXF::Sequence*>(temp_item);

      if ( sequence == 0 )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: %s is not a Sequence item.\n",
				 track->Sequence.get().EncodeHex(buf, 64));
	  return false;
	}

      if ( sequence->StructuralComponents.size() != 1 )
	{
	  DefaultLogSink().Error("The Sequence item must contain one reference to an esence item, found %d.\n",
				 sequence->StructuralComponents.size());
	  return false;
	}

      // SourceClip
      result = header.GetMDObjectByID(sequence->StructuralComponents.front(), &temp_item);

      if ( KM_FAILURE(result) )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: strong reference %s leads nowhere.\n",
				 sequence->StructuralComponents.front().EncodeHex(buf, 64));
	  return false;
	}

      if ( temp_item->IsA(DefaultCompositeDict().ul(MDD_SourceClip)) )
	{
	  MXF::SourceClip *source_clip = dynamic_cast<MXF::SourceClip*>(temp_item);

	  if ( source_clip == 0 )
	    {
	      DefaultLogSink().Error("The MXF header is incomplete: %s is not a SourceClip item.\n",
				     sequence->StructuralComponents.front().EncodeHex(buf, 64));
	      return false;
	    }

	  if ( ! has_first_item )
	    {
	      edit_rate = track->EditRate;
	      has_first_item = true;
	    }
	  else if ( edit_rate != track->EditRate )
	    {
	      DefaultLogSink().Error("The MXF header is incomplete: %s EditRate value does not match others in the file.\n",
				     sequence->StructuralComponents.front().EncodeHex(buf, 64));
	      return false;
	    }
	}
      else if ( ! temp_item->IsA(DefaultCompositeDict().ul(MDD_TimecodeComponent)) )
	{
	  DefaultLogSink().Error("Reference from Sequence to an unexpected type: %s.\n", temp_item->ObjectName());
	  return false;
	}
    }

  return true;
}